

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::WeightParams::ByteSizeLong(WeightParams *this)

{
  bool bVar1;
  uint uVar2;
  int size;
  long lVar3;
  ulong uVar4;
  string *psVar5;
  size_t sVar6;
  int cached_size;
  size_t data_size;
  uint count;
  uint32_t cached_has_bits;
  size_t total_size;
  WeightParams *this_local;
  
  _count = 0;
  uVar2 = _internal_floatvalue_size(this);
  lVar3 = (ulong)uVar2 * 4;
  if ((ulong)uVar2 != 0) {
    _count = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar3);
    _count = _count + 1;
  }
  _count = lVar3 + _count;
  _internal_float16value_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_float16value_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::BytesSize(psVar5);
    _count = sVar6 + 1 + _count;
  }
  _internal_rawvalue_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_rawvalue_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::BytesSize(psVar5);
    _count = sVar6 + 2 + _count;
  }
  _internal_int8rawvalue_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_int8rawvalue_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::BytesSize(psVar5);
    _count = sVar6 + 2 + _count;
  }
  bVar1 = _internal_has_quantization(this);
  if (bVar1) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::QuantizationParams>(this->quantization_);
    _count = sVar6 + 2 + _count;
  }
  bVar1 = _internal_isupdatable(this);
  if (bVar1) {
    _count = _count + 3;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    _count = lVar3 + _count;
  }
  size = google::protobuf::internal::ToCachedSize(_count);
  SetCachedSize(this,size);
  return _count;
}

Assistant:

size_t WeightParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.WeightParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated float floatValue = 1;
  {
    unsigned int count = static_cast<unsigned int>(this->_internal_floatvalue_size());
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    total_size += data_size;
  }

  // bytes float16Value = 2;
  if (!this->_internal_float16value().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
        this->_internal_float16value());
  }

  // bytes rawValue = 30;
  if (!this->_internal_rawvalue().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
        this->_internal_rawvalue());
  }

  // bytes int8RawValue = 31;
  if (!this->_internal_int8rawvalue().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
        this->_internal_int8rawvalue());
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->_internal_has_quantization()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *quantization_);
  }

  // bool isUpdatable = 50;
  if (this->_internal_isupdatable() != 0) {
    total_size += 2 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}